

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O0

void ScaleWithAspect(int *w,int *h,int Width,int Height)

{
  double y;
  double yratio;
  int screenRatio;
  int resRatio;
  int Height_local;
  int Width_local;
  int *h_local;
  int *w_local;
  
  screenRatio = Height;
  resRatio = Width;
  _Height_local = h;
  h_local = w;
  yratio._4_4_ = CheckRatio(Width,Height,(int *)0x0);
  CheckRatio(*h_local,*_Height_local,(int *)&yratio);
  if (yratio._4_4_ != yratio._0_4_) {
    switch(yratio._4_4_) {
    case 0:
      y = 1.3333333333333333;
      break;
    case 1:
      y = 1.7777777777777777;
      break;
    case 2:
      y = 1.6;
      break;
    case 3:
      y = 1.7;
      break;
    case 4:
      y = 1.25;
      break;
    default:
      goto switchD_0037d3b9_default;
    }
    if ((double)*h_local / y <= (double)*_Height_local) {
      *_Height_local = (int)((double)*h_local / y);
    }
    else {
      *h_local = (int)((double)*_Height_local * y);
    }
  }
switchD_0037d3b9_default:
  return;
}

Assistant:

void ScaleWithAspect (int &w, int &h, int Width, int Height)
{
	int resRatio = CheckRatio (Width, Height);
	int screenRatio;
	CheckRatio (w, h, &screenRatio);
	if (resRatio == screenRatio)
		return;

	double yratio;
	switch(resRatio)
	{
		case 0: yratio = 4./3.; break;
		case 1: yratio = 16./9.; break;
		case 2: yratio = 16./10.; break;
		case 3: yratio = 17./10.; break;
		case 4: yratio = 5./4.; break;
		default: return;
	}
	double y = w/yratio;
	if (y > h)
		w = h*yratio;
	else
		h = y;
}